

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMP2.h
# Opt level: O3

void __thiscall XPMP2::GlobVars::GlobVars(GlobVars *this,logLevelTy _logLvl,bool _logMdlMatch)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  
  this->logLvl = _logLvl;
  this->bLogMdlMatch = _logMdlMatch;
  this->bClampAll = false;
  this->bHandleDupId = false;
  this->bObjReplDataRefs = false;
  this->bObjReplTextures = true;
  (this->pathObj8DataRefs)._M_dataplus._M_p = (pointer)&(this->pathObj8DataRefs).field_2;
  (this->pathObj8DataRefs)._M_string_length = 0;
  (this->pathObj8DataRefs).field_2._M_local_buf[0] = '\0';
  (this->listObj8DataRefs).
  super__List_base<XPMP2::Obj8DataRefs,_std::allocator<XPMP2::Obj8DataRefs>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->listObj8DataRefs;
  (this->listObj8DataRefs).
  super__List_base<XPMP2::Obj8DataRefs,_std::allocator<XPMP2::Obj8DataRefs>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->listObj8DataRefs;
  (this->listObj8DataRefs).
  super__List_base<XPMP2::Obj8DataRefs,_std::allocator<XPMP2::Obj8DataRefs>_>._M_impl._M_node.
  _M_size = 0;
  (this->pluginName)._M_dataplus._M_p = (pointer)&(this->pluginName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->pluginName,"(unknown)","");
  (this->logAcronym)._M_dataplus._M_p = (pointer)&(this->logAcronym).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->logAcronym,"(unknown)","");
  this->prefsFuncInt = PrefsFuncIntDefault;
  (this->listObservers).
  super__List_base<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->listObservers;
  (this->listObservers).
  super__List_base<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->listObservers;
  lVar4 = 0;
  (this->listObservers).
  super__List_base<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>._M_impl.
  _M_node._M_size = 0;
  (this->pathDoc8643)._M_dataplus._M_p = (pointer)&(this->pathDoc8643).field_2;
  (this->pathDoc8643)._M_string_length = 0;
  (this->pathDoc8643).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->mapDoc8643)._M_t._M_impl.super__Rb_tree_header;
  (this->mapDoc8643)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapDoc8643)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapDoc8643)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapDoc8643)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapDoc8643)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  do {
    *(char **)((long)&(this->pathRelated)._M_elems[0]._M_dataplus._M_p + lVar4) =
         (this->pathRelated)._M_elems[0].field_2._M_local_buf + lVar4;
    *(undefined8 *)((long)&(this->pathRelated)._M_elems[0]._M_string_length + lVar4) = 0;
    (this->pathRelated)._M_elems[0].field_2._M_local_buf[lVar4] = '\0';
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x40);
  lVar4 = 0;
  do {
    lVar2 = (long)&(this->mapRelated)._M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_color + lVar4;
    puVar3 = (undefined8 *)(&(this->mapRelated)._M_elems[0]._M_t._M_impl.field_0x0 + lVar4);
    *puVar3 = 0;
    puVar3[1] = 0;
    *(undefined8 *)
     ((long)&(this->mapRelated)._M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
     lVar4) = 0;
    *(long *)((long)&(this->mapRelated)._M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left + lVar4) = lVar2;
    *(long *)((long)&(this->mapRelated)._M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_right + lVar4) = lVar2;
    *(undefined8 *)
     ((long)&(this->mapRelated)._M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar4
     ) = 0;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0x60);
  p_Var1 = &(this->mapCSLPkgs)._M_t._M_impl.super__Rb_tree_header;
  (this->mapCSLPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapCSLPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapCSLPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapCSLPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapCSLPkgs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mapCSLModels)._M_t._M_impl.super__Rb_tree_header;
  (this->mapCSLModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapCSLModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapCSLModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapCSLModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapCSLModels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->defaultICAO)._M_dataplus._M_p = (pointer)&(this->defaultICAO).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->defaultICAO,"A320","");
  (this->carIcaoType)._M_dataplus._M_p = (pointer)&(this->carIcaoType).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->carIcaoType,"ZZZC","");
  (this->resourceDir)._M_dataplus._M_p = (pointer)&(this->resourceDir).field_2;
  (this->resourceDir)._M_string_length = 0;
  (this->resourceDir).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->mapAc)._M_t._M_impl.super__Rb_tree_header;
  (this->mapAc)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapAc)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapAc)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapAc)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapAc)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->bDrawLabels = true;
  this->eLabelOverride = SWITCH_CFG_AUTO;
  this->maxLabelDist = 5556.0;
  this->bLabelCutOffAtVisibility = true;
  this->labelFontScaling = 1.0;
  this->bHasControlOfAIAircraft = false;
  this->eAIOverride = SWITCH_CFG_AUTO;
  this->bMapEnabled = true;
  this->bMapLabels = true;
  p_Var1 = &(this->mapMapLayers)._M_t._M_impl.super__Rb_tree_header;
  (this->mapMapLayers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapMapLayers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapMapLayers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapMapLayers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapMapLayers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->pathMapIcons)._M_dataplus._M_p = (pointer)&(this->pathMapIcons).field_2;
  (this->pathMapIcons)._M_string_length = 0;
  (this->pathMapIcons).field_2._M_local_buf[0] = '\0';
  (this->remoteMCGroup)._M_dataplus._M_p = (pointer)&(this->remoteMCGroup).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->remoteMCGroup,"239.255.1.1","");
  this->remotePort = 0xc27c;
  (this->remoteSendIntf)._M_dataplus._M_p = (pointer)&(this->remoteSendIntf).field_2;
  (this->remoteSendIntf)._M_string_length = 0;
  (this->remoteSendIntf).field_2._M_local_buf[0] = '\0';
  this->remoteTTL = 8;
  this->remoteBufSize = 0x2000;
  this->remoteTxfFrequ = 5;
  this->remoteCfg = SWITCH_CFG_AUTO;
  this->remoteCfgFromIni = SWITCH_CFG_AUTO;
  this->remoteStatus = REMOTE_OFF;
  this->contrailAltMin_ft = 25000;
  this->contrailAltMax_ft = 45000;
  this->contrailLifeTime = 0x19;
  this->contrailMulti = false;
  this->bSoundOnStartup = true;
  this->bSoundForceFmodInstance = false;
  this->bSoundMuteOnPause = true;
  this->bSoundAvail = false;
  this->sndMasterVol = 1.0;
  this->bSoundAutoMuted = false;
  this->verXPlane = -1;
  this->verXPLM = -1;
  this->bXPUsingModernGraphicsDriver = false;
  this->bXPNetworkedSetup = false;
  this->pluginId = 0;
  (this->xpThread)._M_thread = 0;
  (this->posCamera).x = 0.0;
  (this->posCamera).y = 0.0;
  (this->posCamera).z = 0.0;
  (this->posCamera).pitch = 0.0;
  (this->posCamera).heading = 0.0;
  (this->posCamera).roll = 0.0;
  *(undefined8 *)&(this->posCamera).zoom = 0;
  (this->prevCamera).y = 0.0;
  (this->prevCamera).z = 0.0;
  (this->prevCamera).pitch = 0.0;
  (this->prevCamera).heading = 0.0;
  (this->prevCamera).roll = 0.0;
  (this->prevCamera).zoom = 0.0;
  this->vCam_x = 0.0;
  this->vCam_y = 0.0;
  this->vCam_z = 0.0;
  this->prevCamera_ts = 0.0;
  this->xpCycleNum = 0;
  this->planeId = 0;
  return;
}

Assistant:

GlobVars (logLevelTy _logLvl = logINFO, bool _logMdlMatch = false) :
    logLvl(_logLvl), bLogMdlMatch(_logMdlMatch) {}